

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftstroke.c
# Opt level: O0

FT_Error FT_Glyph_StrokeBorder(FT_Glyph *pglyph,FT_Stroker stroker,FT_Bool inside,FT_Bool destroy)

{
  FT_UInt local_58;
  FT_UInt local_54;
  FT_UInt num_contours;
  FT_UInt num_points;
  FT_Outline *outline;
  FT_OutlineGlyph pFStack_40;
  FT_StrokerBorder border;
  FT_OutlineGlyph oglyph;
  FT_Glyph copy;
  FT_Library library;
  FT_Glyph glyph;
  FT_Error error;
  FT_Bool destroy_local;
  FT_Bool inside_local;
  FT_Stroker stroker_local;
  FT_Glyph *pglyph_local;
  
  glyph._0_4_ = 6;
  copy = (FT_Glyph)stroker->library;
  if ((((pglyph != (FT_Glyph *)0x0) && (library = (FT_Library)*pglyph, library != (FT_Library)0x0))
      && (*(FT_Glyph_Class **)&library->version_major == &ft_outline_glyph_class)) &&
     (glyph._6_1_ = destroy, glyph._7_1_ = inside, _error = stroker,
     stroker_local = (FT_Stroker)pglyph,
     glyph._0_4_ = FT_Glyph_Copy((FT_Glyph)library,(FT_Glyph *)&oglyph), (FT_Error)glyph == 0)) {
    library = (FT_Library)oglyph;
    pFStack_40 = oglyph;
    _num_contours = &oglyph->outline;
    outline._4_4_ = FT_Outline_GetOutsideBorder(_num_contours);
    if (glyph._7_1_ != '\0') {
      outline._4_4_ = (FT_StrokerBorder)(outline._4_4_ == FT_STROKER_BORDER_LEFT);
    }
    glyph._0_4_ = FT_Stroker_ParseOutline(_error,_num_contours,'\0');
    if ((FT_Error)glyph == 0) {
      FT_Stroker_GetBorderCounts(_error,outline._4_4_,&local_54,&local_58);
      FT_Outline_Done((FT_Library)library->memory,_num_contours);
      glyph._0_4_ = FT_Outline_New((FT_Library)library->memory,local_54,local_58,_num_contours);
      if ((FT_Error)glyph == 0) {
        _num_contours->n_points = 0;
        _num_contours->n_contours = 0;
        FT_Stroker_ExportBorder(_error,outline._4_4_,_num_contours);
        if (glyph._6_1_ != '\0') {
          FT_Done_Glyph((FT_Glyph)stroker_local->angle_in);
        }
        stroker_local->angle_in = (FT_Angle)library;
        return (FT_Error)glyph;
      }
    }
    FT_Done_Glyph((FT_Glyph)library);
    if (glyph._6_1_ == '\0') {
      stroker_local->angle_in = 0;
    }
  }
  return (FT_Error)glyph;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Glyph_StrokeBorder( FT_Glyph    *pglyph,
                         FT_Stroker   stroker,
                         FT_Bool      inside,
                         FT_Bool      destroy )
  {
    FT_Error  error = FT_ERR( Invalid_Argument );
    FT_Glyph  glyph = NULL;

    /* for FT_OUTLINE_GLYPH_CLASS_GET (in PIC mode) */
    FT_Library  library = stroker->library;

    FT_UNUSED( library );


    if ( !pglyph )
      goto Exit;

    glyph = *pglyph;
    if ( !glyph || glyph->clazz != FT_OUTLINE_GLYPH_CLASS_GET )
      goto Exit;

    {
      FT_Glyph  copy;


      error = FT_Glyph_Copy( glyph, &copy );
      if ( error )
        goto Exit;

      glyph = copy;
    }

    {
      FT_OutlineGlyph   oglyph  = (FT_OutlineGlyph)glyph;
      FT_StrokerBorder  border;
      FT_Outline*       outline = &oglyph->outline;
      FT_UInt           num_points, num_contours;


      border = FT_Outline_GetOutsideBorder( outline );
      if ( inside )
      {
        if ( border == FT_STROKER_BORDER_LEFT )
          border = FT_STROKER_BORDER_RIGHT;
        else
          border = FT_STROKER_BORDER_LEFT;
      }

      error = FT_Stroker_ParseOutline( stroker, outline, FALSE );
      if ( error )
        goto Fail;

      FT_Stroker_GetBorderCounts( stroker, border,
                                  &num_points, &num_contours );

      FT_Outline_Done( glyph->library, outline );

      error = FT_Outline_New( glyph->library,
                              num_points,
                              (FT_Int)num_contours,
                              outline );
      if ( error )
        goto Fail;

      outline->n_points   = 0;
      outline->n_contours = 0;

      FT_Stroker_ExportBorder( stroker, border, outline );
    }

    if ( destroy )
      FT_Done_Glyph( *pglyph );

    *pglyph = glyph;
    goto Exit;

  Fail:
    FT_Done_Glyph( glyph );
    glyph = NULL;

    if ( !destroy )
      *pglyph = NULL;

  Exit:
    return error;
  }